

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O1

void __thiscall
StringType::DoGenParseCode(StringType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  Expr *this_00;
  bool bVar1;
  Exception *this_01;
  char *pcVar2;
  ID *pIVar3;
  int len;
  string str_size;
  int local_6c;
  string local_68;
  string local_48;
  
  GenStringSize_abi_cxx11_(&local_68,this,out_cc,env,data);
  if (*(int *)&(this->super_Type).field_0x18c == 0) {
    GenCheckingCStr(this,out_cc,env,data,&local_68);
  }
  if ((this->super_Type).anonymous_value_var_ != false) goto LAB_00125a60;
  if ((*(int *)&(this->super_Type).field_0x18c == 2) &&
     (this_00 = (this->super_Type).attr_length_expr_, this_00 != (Expr *)0x0)) {
    bVar1 = Expr::ConstFold(this_00,env,&local_6c);
    if (!bVar1) goto LAB_001259f2;
    if (local_6c < 0) {
      this_01 = (Exception *)__cxa_allocate_exception(0x20);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"negative &length on string","");
      Exception::Exception(this_01,&(this->super_Type).super_Object,&local_48);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
LAB_001259f2:
    Output::println(out_cc,"// check for negative sizes");
    Output::println(out_cc,"if ( %s < 0 )",local_68._M_dataplus._M_p);
    Output::println(out_cc,"throw binpac::ExceptionInvalidStringLength(\"%s\", %s);",
                    (this->super_Type).super_Object.location._M_dataplus._M_p,
                    local_68._M_dataplus._M_p);
  }
  pcVar2 = Env::LValue(env,(this->super_Type).value_var_);
  Output::println(out_cc,"%s.init(%s, %s);",pcVar2,(data->ptr_expr_)._M_dataplus._M_p,
                  local_68._M_dataplus._M_p);
LAB_00125a60:
  pIVar3 = Type::parsing_complete_var(&this->super_Type);
  if (pIVar3 != (ID *)0x0) {
    pIVar3 = Type::parsing_complete_var(&this->super_Type);
    pcVar2 = Env::LValue(env,pIVar3);
    Output::println(out_cc,"%s = true;",pcVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StringType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	string str_size = GenStringSize(out_cc, env, data);

	// Generate additional checking
	switch ( type_ )
		{
		case CSTR:
			GenCheckingCStr(out_cc, env, data, str_size);
			break;
		case REGEX:
		case ANYSTR:
			break;
		}

	if ( ! anonymous_value_var() )
		{
		// Set the value variable

		int len;

		if ( type_ == ANYSTR && attr_length_expr_ && attr_length_expr_->ConstFold(env, &len) )
			{
			// can check for a negative length now
			if ( len < 0 )
				throw Exception(this, "negative &length on string");
			}
		else
			{
			out_cc->println("// check for negative sizes");
			out_cc->println("if ( %s < 0 )", str_size.c_str());
			out_cc->println("throw binpac::ExceptionInvalidStringLength(\"%s\", %s);", Location(),
			                str_size.c_str());
			}

		out_cc->println("%s.init(%s, %s);", env->LValue(value_var()), data.ptr_expr(),
		                str_size.c_str());
		}

	if ( parsing_complete_var() )
		{
		out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
		}
	}